

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.cpp
# Opt level: O1

string * __thiscall
amrex::ParallelDescriptor::mpi_level_to_string_abi_cxx11_
          (string *__return_storage_ptr__,ParallelDescriptor *this,int mtlev)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"UNKNOWN","");
  return __return_storage_ptr__;
}

Assistant:

std::string
mpi_level_to_string (int mtlev)
{
    amrex::ignore_unused(mtlev);
#ifdef AMREX_USE_MPI
    if (mtlev == MPI_THREAD_SINGLE)
        return std::string("MPI_THREAD_SINGLE");
    if (mtlev == MPI_THREAD_FUNNELED)
        return std::string("MPI_THREAD_FUNNELED");
    if (mtlev == MPI_THREAD_SERIALIZED)
        return std::string("MPI_THREAD_SERIALIZED");
    if (mtlev == MPI_THREAD_MULTIPLE)
        return std::string("MPI_THREAD_MULTIPLE");
#endif
    return std::string("UNKNOWN");
}